

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMS_ALG_PROPERTY_Array_Marshal
                 (TPMS_ALG_PROPERTY *source,BYTE **buffer,INT32 *size,INT32 count)

{
  ulong uVar1;
  
  if (0 < count) {
    uVar1 = (ulong)(uint)count;
    do {
      UINT16_Marshal(&source->alg,buffer,size);
      UINT32_Marshal((UINT32 *)&source->algProperties,buffer,size);
      source = source + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    return (short)count * 6;
  }
  return 0;
}

Assistant:

UINT16
TPMS_ALG_PROPERTY_Array_Marshal(TPMS_ALG_PROPERTY *source, BYTE **buffer, INT32 *size, INT32 count)
{
    UINT16    result = 0;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = (UINT16)(result + TPMS_ALG_PROPERTY_Marshal(&source[i], buffer, size));
    }
    return result;
}